

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testharness.cc
# Opt level: O0

int leveldb::test::RunAllTests(void)

{
  char *__needle;
  Test *pTVar1;
  reference pvVar2;
  char *pcVar3;
  allocator local_49;
  string local_48 [8];
  string name;
  Test *t;
  size_t i;
  int num;
  char *matcher;
  
  __needle = getenv("LEVELDB_TESTS");
  i._4_4_ = 0;
  if ((anonymous_namespace)::tests !=
      (vector<leveldb::test::(anonymous_namespace)::Test,_std::allocator<leveldb::test::(anonymous_namespace)::Test>_>
       *)0x0) {
    for (t = (Test *)0x0;
        pTVar1 = (Test *)std::
                         vector<leveldb::test::(anonymous_namespace)::Test,_std::allocator<leveldb::test::(anonymous_namespace)::Test>_>
                         ::size((anonymous_namespace)::tests), t < pTVar1;
        t = (Test *)((long)&t->base + 1)) {
      pvVar2 = std::
               vector<leveldb::test::(anonymous_namespace)::Test,_std::allocator<leveldb::test::(anonymous_namespace)::Test>_>
               ::operator[]((anonymous_namespace)::tests,(size_type)t);
      if (__needle == (char *)0x0) {
LAB_001074b4:
        fprintf(_stderr,"==== Test %s.%s\n",pvVar2->base,pvVar2->name);
        (*pvVar2->func)();
        i._4_4_ = i._4_4_ + 1;
      }
      else {
        pcVar3 = pvVar2->base;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_48,pcVar3,&local_49);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
        std::__cxx11::string::push_back((char)local_48);
        std::__cxx11::string::append((char *)local_48);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        pcVar3 = strstr(pcVar3,__needle);
        std::__cxx11::string::~string(local_48);
        if (pcVar3 != (char *)0x0) goto LAB_001074b4;
      }
    }
  }
  fprintf(_stderr,"==== PASSED %d tests\n",(ulong)i._4_4_);
  return 0;
}

Assistant:

int RunAllTests() {
  const char* matcher = getenv("LEVELDB_TESTS");

  int num = 0;
  if (tests != nullptr) {
    for (size_t i = 0; i < tests->size(); i++) {
      const Test& t = (*tests)[i];
      if (matcher != nullptr) {
        std::string name = t.base;
        name.push_back('.');
        name.append(t.name);
        if (strstr(name.c_str(), matcher) == nullptr) {
          continue;
        }
      }
      fprintf(stderr, "==== Test %s.%s\n", t.base, t.name);
      (*t.func)();
      ++num;
    }
  }
  fprintf(stderr, "==== PASSED %d tests\n", num);
  return 0;
}